

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_map.hpp
# Opt level: O1

ostream * operator<<(ostream *out,
                    skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
                    *sl)

{
  uint uVar1;
  pointer pbVar2;
  _Alloc_hider _Var3;
  pointer ppSVar4;
  char cVar5;
  ostream oVar6;
  ostream *poVar7;
  mapped_type *pmVar8;
  uint *puVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pSVar13;
  pointer ppSVar14;
  pointer pbVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  char *local_88;
  long local_80;
  char local_78 [16];
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_68;
  
  cVar5 = (char)out;
  if ((sl->key).
      super__Vector_base<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (sl->key).
      super__Vector_base<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"EMPTY SKIPLIST",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar5);
    std::ostream::put(cVar5);
    poVar7 = (ostream *)std::ostream::flush();
    return poVar7;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"Values: ",8);
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl._0_8_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  pSVar13 = (*(sl->key).
              super__Vector_base<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start)->next;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pSVar13 ==
      (SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    iVar10 = 0;
  }
  else {
    iVar10 = 0;
    do {
      pbVar2 = *(pointer *)
                ((long)&(pSVar13->valz).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                + 8);
      for (pbVar15 = *(pointer *)
                      &(pSVar13->valz).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl; pbVar15 != pbVar2; pbVar15 = pbVar15 + 1) {
        _Var3._M_p = (pbVar15->_M_dataplus)._M_p;
        local_88 = local_78;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,_Var3._M_p,_Var3._M_p + pbVar15->_M_string_length);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>(out,local_88,local_80);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
        if (local_88 != local_78) {
          operator_delete(local_88);
        }
      }
      pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&local_68,&pSVar13->val);
      *pmVar8 = iVar10;
      iVar10 = iVar10 + 1;
      pSVar13 = pSVar13->next;
    } while (pSVar13 !=
             (SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x0);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  ppSVar4 = (sl->key).
            super__Vector_base<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppSVar14 = (sl->key).
             super__Vector_base<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  while (ppSVar14 != ppSVar4) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"S",1);
    pSVar13 = ppSVar14[-1];
    ppSVar14 = ppSVar14 + -1;
    uVar11 = 0xffffffff;
    while (pSVar13 = pSVar13->next,
          pSVar13 !=
          (SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x0) {
      puVar9 = (uint *)std::
                       map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                       operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)&local_68,&pSVar13->val);
      uVar1 = *puVar9;
      if (1 < (int)(uVar1 - uVar11)) {
        iVar12 = ~uVar11 + uVar1;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(out,"----",4);
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"-",1);
      poVar7 = out + *(long *)(*(long *)out + -0x18);
      if (out[*(long *)(*(long *)out + -0x18) + 0xe1] == (ostream)0x0) {
        oVar6 = (ostream)std::ios::widen((char)poVar7);
        poVar7[0xe0] = oVar6;
        poVar7[0xe1] = (ostream)0x1;
      }
      poVar7[0xe0] = (ostream)0x2d;
      *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 3;
      std::ostream::operator<<((ostream *)out,pSVar13->val);
      uVar11 = uVar1;
    }
    if (1 < (int)(iVar10 - uVar11)) {
      iVar12 = (iVar10 + -1) - uVar11;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(out,"----",4);
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"-E",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar5);
    std::ostream::put(cVar5);
    std::ostream::flush();
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_68);
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const skiplist<T, V, X>& sl) {
    if (sl.key.empty()) {
        return out << "EMPTY SKIPLIST" << std::endl;
    }

    out << "Values: ";
    // store mapping of node->index in a map
    std::map<T, int> index_store{};
    auto bottom_it = (*(sl.key.begin()))->next;
    int cur_index = 0;
    while (bottom_it) {
        for (auto value : bottom_it->valz) {
          out << value << ", ";
        }

        index_store[bottom_it->val] = cur_index;
        cur_index++;
        bottom_it = bottom_it->next;
    }
    out << std::endl;

    auto level = sl.key.rbegin();
    auto end = sl.key.rend();
    while(level != end) {
        // S denotes start of level, could be something different
        out << "S";

        // to store previous element's index
        // and current element's index
        int index = -1, next_index;
        // skip the first element - it is always 0
        auto it = (*level)->next;
        // iterate through the list at this level
        while (it) {
            next_index = index_store[it->val];

            // filler to align it correctly
            // when elements in between don't exist at this level
            for (int i = 1; i < next_index - index; ++i) {
                out << "----";
            }

            // width of printed element is hardcoded to 3 for now
            // the padding is filled with ""-"
            out << "-" << std::setfill('-') << std::setw(3) << it->val;
            it = it->next;

            index = next_index;
        }
        next_index = cur_index;

        for (int i = 1; i < next_index - index; ++i) {
            out << "----";
        }

        out << "-E";

        out << std::endl;

        level++;
    }

    return out;
}